

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportOneDensity(HighsSimplexAnalysis *this,double density)

{
  type pbVar1;
  HighsSimplexAnalysis *in_RDI;
  HighsInt log_10_density;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff88;
  string *format;
  string local_68 [48];
  string local_38 [36];
  uint local_14;
  
  local_14 = intLog10(in_RDI,in_stack_ffffffffffffff88);
  if ((int)local_14 < -0x62) {
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff70);
    pbVar1 = pbVar1 + 0x10;
    highsFormatToString_abi_cxx11_((char *)local_68,"     ");
    std::operator<<((ostream *)pbVar1,local_68);
    std::__cxx11::string::~string(local_68);
  }
  else {
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffff70);
    format = local_38;
    highsFormatToString_abi_cxx11_((char *)format," %4d",(ulong)local_14);
    std::operator<<((ostream *)(pbVar1 + 0x10),format);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportOneDensity(const double density) {
  assert(
      // analyse_simplex_summary_data ||
      analyse_simplex_runtime_data);
  const HighsInt log_10_density = intLog10(density);
  if (log_10_density > -99) {
    *analysis_log << highsFormatToString(" %4" HIGHSINT_FORMAT "",
                                         log_10_density);
  } else {
    *analysis_log << highsFormatToString("     ");
  }
}